

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O3

void append_suite::append_string_with_real(void)

{
  bool bVar1;
  variable data;
  undefined1 local_99;
  type local_98;
  undefined1 local_78;
  basic_variable<std::allocator<char>_> local_68;
  longdouble local_2c;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_68,"alpha");
  local_98.__data[0] =
       trial::dynamic::detail::
       small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
       ::
       call<trial::dynamic::basic_variable<std::allocator<char>>::similar_visitor<std::__cxx11::string>,bool>
                 ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                   *)&local_68);
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x55f,"void append_suite::append_string_with_real()",&local_98,&local_99);
  local_78 = 0xc;
  local_98._0_4_ = 0x40400000;
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            (&local_68,(basic_variable<std::allocator<char>_> *)&local_98.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_98.__align);
  boost::detail::throw_failed_impl
            ("data.operator+=(variable(3.0f))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x562,"void append_suite::append_string_with_real()");
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_68,"alpha");
  bVar1 = trial::dynamic::detail::
          small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
          ::
          call<trial::dynamic::basic_variable<std::allocator<char>>::similar_visitor<std::__cxx11::string>,bool>
                    ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                      *)&local_68);
  local_98.__data[0] = bVar1;
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x567,"void append_suite::append_string_with_real()",&local_98,&local_99);
  local_78 = 0xd;
  local_98._0_8_ = 0x4008000000000000;
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            (&local_68,(basic_variable<std::allocator<char>_> *)&local_98.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_98.__align);
  boost::detail::throw_failed_impl
            ("data.operator+=(variable(3.0))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x56a,"void append_suite::append_string_with_real()");
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_68,"alpha");
  bVar1 = trial::dynamic::detail::
          small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
          ::
          call<trial::dynamic::basic_variable<std::allocator<char>>::similar_visitor<std::__cxx11::string>,bool>
                    ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                      *)&local_68);
  local_98.__data[0] = bVar1;
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x56f,"void append_suite::append_string_with_real()",&local_98,&local_99);
  local_78 = 0xe;
  local_98._0_10_ = (unkbyte10)3.0;
  local_2c = (longdouble)local_98._0_10_;
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            (&local_68,(basic_variable<std::allocator<char>_> *)&local_98.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_98.__align);
  boost::detail::throw_failed_impl
            ("data.operator+=(variable(3.0L))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x572,"void append_suite::append_string_with_real()");
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_68,L"bravo");
  bVar1 = trial::dynamic::detail::
          small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
          ::
          call<trial::dynamic::basic_variable<std::allocator<char>>::similar_visitor<std::__cxx11::wstring>,bool>
                    ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                      *)&local_68);
  local_98.__data[0] = bVar1;
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<wstring>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x577,"void append_suite::append_string_with_real()",&local_98,&local_99);
  local_78 = 0xc;
  local_98._0_4_ = 0x40400000;
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            (&local_68,(basic_variable<std::allocator<char>_> *)&local_98.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_98.__align);
  boost::detail::throw_failed_impl
            ("data.operator+=(variable(3.0f))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x57a,"void append_suite::append_string_with_real()");
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_68,L"bravo");
  bVar1 = trial::dynamic::detail::
          small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
          ::
          call<trial::dynamic::basic_variable<std::allocator<char>>::similar_visitor<std::__cxx11::wstring>,bool>
                    ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                      *)&local_68);
  local_98.__data[0] = bVar1;
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<wstring>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x57f,"void append_suite::append_string_with_real()",&local_98,&local_99);
  local_78 = 0xd;
  local_98._0_8_ = 0x4008000000000000;
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            (&local_68,(basic_variable<std::allocator<char>_> *)&local_98.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_98.__align);
  boost::detail::throw_failed_impl
            ("data.operator+=(variable(3.0))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x582,"void append_suite::append_string_with_real()");
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_68,L"bravo");
  bVar1 = trial::dynamic::detail::
          small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
          ::
          call<trial::dynamic::basic_variable<std::allocator<char>>::similar_visitor<std::__cxx11::wstring>,bool>
                    ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                      *)&local_68);
  local_98.__data[0] = bVar1;
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<wstring>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x587,"void append_suite::append_string_with_real()",&local_98,&local_99);
  local_78 = 0xe;
  local_98._0_10_ = local_2c;
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            (&local_68,(basic_variable<std::allocator<char>_> *)&local_98.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_98.__align);
  boost::detail::throw_failed_impl
            ("data.operator+=(variable(3.0L))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x58a,"void append_suite::append_string_with_real()");
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_68,L"charlie");
  bVar1 = trial::dynamic::detail::
          small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
          ::
          call<trial::dynamic::basic_variable<std::allocator<char>>::similar_visitor<std::__cxx11::u16string>,bool>
                    ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                      *)&local_68);
  local_98.__data[0] = bVar1;
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<u16string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x58f,"void append_suite::append_string_with_real()",&local_98,&local_99);
  local_78 = 0xc;
  local_98._0_4_ = 0x40400000;
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            (&local_68,(basic_variable<std::allocator<char>_> *)&local_98.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_98.__align);
  boost::detail::throw_failed_impl
            ("data.operator+=(variable(3.0f))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x592,"void append_suite::append_string_with_real()");
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_68,L"charlie");
  bVar1 = trial::dynamic::detail::
          small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
          ::
          call<trial::dynamic::basic_variable<std::allocator<char>>::similar_visitor<std::__cxx11::u16string>,bool>
                    ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                      *)&local_68);
  local_98.__data[0] = bVar1;
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<u16string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x597,"void append_suite::append_string_with_real()",&local_98,&local_99);
  local_78 = 0xd;
  local_98._0_8_ = 0x4008000000000000;
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            (&local_68,(basic_variable<std::allocator<char>_> *)&local_98.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_98.__align);
  boost::detail::throw_failed_impl
            ("data.operator+=(variable(3.0))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x59a,"void append_suite::append_string_with_real()");
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_68,L"charlie");
  bVar1 = trial::dynamic::detail::
          small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
          ::
          call<trial::dynamic::basic_variable<std::allocator<char>>::similar_visitor<std::__cxx11::u16string>,bool>
                    ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                      *)&local_68);
  local_98.__data[0] = bVar1;
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<u16string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x59f,"void append_suite::append_string_with_real()",&local_98,&local_99);
  local_78 = 0xe;
  local_98._0_10_ = local_2c;
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            (&local_68,(basic_variable<std::allocator<char>_> *)&local_98.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_98.__align);
  boost::detail::throw_failed_impl
            ("data.operator+=(variable(3.0L))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x5a2,"void append_suite::append_string_with_real()");
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_68,L"delta");
  bVar1 = trial::dynamic::detail::
          small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
          ::
          call<trial::dynamic::basic_variable<std::allocator<char>>::similar_visitor<std::__cxx11::u32string>,bool>
                    ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                      *)&local_68);
  local_98.__data[0] = bVar1;
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<u32string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x5a7,"void append_suite::append_string_with_real()",&local_98,&local_99);
  local_78 = 0xc;
  local_98._0_4_ = 0x40400000;
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            (&local_68,(basic_variable<std::allocator<char>_> *)&local_98.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_98.__align);
  boost::detail::throw_failed_impl
            ("data.operator+=(variable(3.0f))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x5aa,"void append_suite::append_string_with_real()");
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_68,L"delta");
  bVar1 = trial::dynamic::detail::
          small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
          ::
          call<trial::dynamic::basic_variable<std::allocator<char>>::similar_visitor<std::__cxx11::u32string>,bool>
                    ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                      *)&local_68);
  local_98.__data[0] = bVar1;
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<u32string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x5af,"void append_suite::append_string_with_real()",&local_98,&local_99);
  local_78 = 0xd;
  local_98._0_8_ = 0x4008000000000000;
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            (&local_68,(basic_variable<std::allocator<char>_> *)&local_98.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_98.__align);
  boost::detail::throw_failed_impl
            ("data.operator+=(variable(3.0))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x5b2,"void append_suite::append_string_with_real()");
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_68,L"delta");
  bVar1 = trial::dynamic::detail::
          small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
          ::
          call<trial::dynamic::basic_variable<std::allocator<char>>::similar_visitor<std::__cxx11::u32string>,bool>
                    ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                      *)&local_68);
  local_98.__data[0] = bVar1;
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<u32string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x5b7,"void append_suite::append_string_with_real()",&local_98,&local_99);
  local_78 = 0xe;
  local_98._0_10_ = local_2c;
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            (&local_68,(basic_variable<std::allocator<char>_> *)&local_98.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_98.__align);
  boost::detail::throw_failed_impl
            ("data.operator+=(variable(3.0L))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x5ba,"void append_suite::append_string_with_real()");
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_68);
  return;
}

Assistant:

void append_string_with_real()
{
    // string - float
    {
        variable data("alpha");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<string>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(3.0f)),
                                        error,
                                        "incompatible type");
    }
    // string - double
    {
        variable data("alpha");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<string>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(3.0)),
                                        error,
                                        "incompatible type");
    }
    // string - long double
    {
        variable data("alpha");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<string>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(3.0L)),
                                        error,
                                        "incompatible type");
    }
    // wstring - float
    {
        variable data(L"bravo");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<wstring>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(3.0f)),
                                        error,
                                        "incompatible type");
    }
    // wstring - double
    {
        variable data(L"bravo");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<wstring>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(3.0)),
                                        error,
                                        "incompatible type");
    }
    // wstring - long double
    {
        variable data(L"bravo");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<wstring>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(3.0L)),
                                        error,
                                        "incompatible type");
    }
    // u16string - float
    {
        variable data(u"charlie");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<u16string>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(3.0f)),
                                        error,
                                        "incompatible type");
    }
    // u16string - double
    {
        variable data(u"charlie");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<u16string>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(3.0)),
                                        error,
                                        "incompatible type");
    }
    // u16string - long double
    {
        variable data(u"charlie");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<u16string>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(3.0L)),
                                        error,
                                        "incompatible type");
    }
    // u32string - float
    {
        variable data(U"delta");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<u32string>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(3.0f)),
                                        error,
                                        "incompatible type");
    }
    // u32string - double
    {
        variable data(U"delta");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<u32string>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(3.0)),
                                        error,
                                        "incompatible type");
    }
    // u32string - long double
    {
        variable data(U"delta");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<u32string>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(3.0L)),
                                        error,
                                        "incompatible type");
    }
}